

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::TablePrinter::open(TablePrinter *this,char *__file,int __oflag,...)

{
  pointer pCVar1;
  int in_EAX;
  ostream *poVar2;
  ColumnInfo *info;
  pointer pCVar3;
  
  if (this->m_isOpen != false) {
    return in_EAX;
  }
  this->m_isOpen = true;
  Catch::operator<<();
  pCVar1 = (this->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->m_columnInfos).
                super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    std::operator<<((ostream *)&this->m_oss,(string *)pCVar3);
    Catch::operator<<(this);
  }
  Catch::operator<<(this);
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019cd70 = 0x2d2d2d2d2d2d2d;
    uRam000000000019cd77._0_1_ = '-';
    uRam000000000019cd77._1_1_ = '-';
    uRam000000000019cd77._2_1_ = '-';
    uRam000000000019cd77._3_1_ = '-';
    uRam000000000019cd77._4_1_ = '-';
    uRam000000000019cd77._5_1_ = '-';
    uRam000000000019cd77._6_1_ = '-';
    uRam000000000019cd77._7_1_ = '-';
    DAT_0019cd60 = '-';
    DAT_0019cd60_1._0_1_ = '-';
    DAT_0019cd60_1._1_1_ = '-';
    DAT_0019cd60_1._2_1_ = '-';
    DAT_0019cd60_1._3_1_ = '-';
    DAT_0019cd60_1._4_1_ = '-';
    DAT_0019cd60_1._5_1_ = '-';
    DAT_0019cd60_1._6_1_ = '-';
    uRam000000000019cd68 = 0x2d2d2d2d2d2d2d;
    DAT_0019cd6f = 0x2d;
    DAT_0019cd50 = '-';
    DAT_0019cd50_1._0_1_ = '-';
    DAT_0019cd50_1._1_1_ = '-';
    DAT_0019cd50_1._2_1_ = '-';
    DAT_0019cd50_1._3_1_ = '-';
    DAT_0019cd50_1._4_1_ = '-';
    DAT_0019cd50_1._5_1_ = '-';
    DAT_0019cd50_1._6_1_ = '-';
    uRam000000000019cd58._0_1_ = '-';
    uRam000000000019cd58._1_1_ = '-';
    uRam000000000019cd58._2_1_ = '-';
    uRam000000000019cd58._3_1_ = '-';
    uRam000000000019cd58._4_1_ = '-';
    uRam000000000019cd58._5_1_ = '-';
    uRam000000000019cd58._6_1_ = '-';
    uRam000000000019cd58._7_1_ = '-';
    DAT_0019cd40 = '-';
    DAT_0019cd40_1._0_1_ = '-';
    DAT_0019cd40_1._1_1_ = '-';
    DAT_0019cd40_1._2_1_ = '-';
    DAT_0019cd40_1._3_1_ = '-';
    DAT_0019cd40_1._4_1_ = '-';
    DAT_0019cd40_1._5_1_ = '-';
    DAT_0019cd40_1._6_1_ = '-';
    uRam000000000019cd48._0_1_ = '-';
    uRam000000000019cd48._1_1_ = '-';
    uRam000000000019cd48._2_1_ = '-';
    uRam000000000019cd48._3_1_ = '-';
    uRam000000000019cd48._4_1_ = '-';
    uRam000000000019cd48._5_1_ = '-';
    uRam000000000019cd48._6_1_ = '-';
    uRam000000000019cd48._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019cd38._0_1_ = '-';
    uRam000000000019cd38._1_1_ = '-';
    uRam000000000019cd38._2_1_ = '-';
    uRam000000000019cd38._3_1_ = '-';
    uRam000000000019cd38._4_1_ = '-';
    uRam000000000019cd38._5_1_ = '-';
    uRam000000000019cd38._6_1_ = '-';
    uRam000000000019cd38._7_1_ = '-';
    DAT_0019cd7f = 0;
  }
  poVar2 = std::operator<<((ostream *)this->m_os,&getLineOfChars<(char)45>()::line);
  poVar2 = std::operator<<(poVar2,"\n");
  return (int)poVar2;
}

Assistant:

void open() {
        if (!m_isOpen) {
            m_isOpen = true;
            *this << RowBreak();
            for (auto const& info : m_columnInfos)
                *this << info.name << ColumnBreak();
            *this << RowBreak();
            m_os << Catch::getLineOfChars<'-'>() << "\n";
        }
    }